

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_textedit_delete_selection(nk_text_edit *state)

{
  int where;
  int where_00;
  
  nk_textedit_clamp(state);
  where = state->select_start;
  where_00 = state->select_end;
  if (where - where_00 != 0) {
    if (where < where_00) {
      nk_textedit_delete(state,where,where_00 - where);
      state->cursor = state->select_start;
      state->select_end = state->select_start;
    }
    else {
      nk_textedit_delete(state,where_00,where - where_00);
      state->cursor = state->select_end;
      state->select_start = state->select_end;
    }
    state->has_preferred_x = '\0';
  }
  return;
}

Assistant:

NK_API void
nk_textedit_delete_selection(struct nk_text_edit *state)
{
    /* delete the section */
    nk_textedit_clamp(state);
    if (NK_TEXT_HAS_SELECTION(state)) {
        if (state->select_start < state->select_end) {
            nk_textedit_delete(state, state->select_start,
                state->select_end - state->select_start);
            state->select_end = state->cursor = state->select_start;
        } else {
            nk_textedit_delete(state, state->select_end,
                state->select_start - state->select_end);
            state->select_start = state->cursor = state->select_end;
        }
        state->has_preferred_x = 0;
    }
}